

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaAddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *local_30;
  RepeatedPtrFieldBase *repeated;
  Message *new_entry_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",CPPTYPE_MESSAGE);
  }
  anon_unknown_0::CheckInvalidAccess(&this->schema_,field);
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    internal::ExtensionSet::UnsafeArenaAddAllocatedMessage
              (this_00,field,&new_entry->super_MessageLite);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      local_30 = internal::MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      local_30 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    internal::RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              (local_30,new_entry);
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaAddAllocatedMessage(Message* message,
                                                const FieldDescriptor* field,
                                                Message* new_entry) const {
  USAGE_CHECK_ALL(UnsafeArenaAddAllocatedMessage, REPEATED, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaAddAllocatedMessage(field,
                                                                 new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message>>(new_entry);
  }
}